

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPlaneDetectorLocationEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XrPlaneDetectorLocationEXT *pXVar2;
  byte bVar3;
  XrStructureType XVar4;
  XrPlaneDetectorOrientationEXT XVar5;
  XrPlaneDetectorSemanticTypeEXT XVar6;
  pointer pcVar7;
  PFN_xrStructureTypeToString p_Var8;
  void *value_00;
  XrStructureType __val;
  XrPlaneDetectorOrientationEXT __val_00;
  XrPlaneDetectorSemanticTypeEXT __val_01;
  uint uVar9;
  char cVar10;
  bool bVar11;
  char *pcVar12;
  XrInstance pXVar13;
  invalid_argument *piVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  char cVar20;
  XrGeneratedDispatchTable *pXVar21;
  string extents_prefix;
  string pose_prefix;
  string next_prefix;
  string type_prefix;
  string semantictype_prefix;
  string orientation_prefix;
  string locationflags_prefix;
  string planeid_prefix;
  string polygonbuffercount_prefix;
  ostringstream oss_polygonBufferCount;
  ostringstream oss_planeId;
  long *local_500;
  long local_4f8;
  long local_4f0 [2];
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  long *local_4c0;
  long local_4b8;
  long local_4b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  string local_3c0;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [24];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  PFN_xrSetInputDeviceActiveEXT local_188;
  PFN_xrSubmitDebugUtilsMessageEXT p_Stack_180;
  PFN_xrSetInputDeviceStateFloatEXT local_178;
  PFN_xrSetInputDeviceStateVector2fEXT p_Stack_170;
  ios_base local_138 [264];
  
  paVar1 = &local_1a8.field_2;
  local_320._0_8_ = value;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,'\x12');
  *local_1a8._M_dataplus._M_p = '0';
  local_1a8._M_dataplus._M_p[1] = 'x';
  pcVar12 = local_1a8._M_dataplus._M_p + local_1a8._M_string_length + -1;
  lVar16 = 0;
  do {
    bVar3 = local_320[lVar16];
    *pcVar12 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
    pcVar12[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
    lVar16 = lVar16 + 1;
    pcVar12 = pcVar12 + -2;
  } while (lVar16 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4a0);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar4 = value->type;
    __val = -XVar4;
    if (0 < (int)XVar4) {
      __val = XVar4;
    }
    uVar19 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar18 = (ulong)__val;
      uVar9 = 4;
      do {
        uVar19 = uVar9;
        uVar15 = (uint)uVar18;
        if (uVar15 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_00204684;
        }
        if (uVar15 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_00204684;
        }
        if (uVar15 < 10000) goto LAB_00204684;
        uVar18 = uVar18 / 10000;
        uVar9 = uVar19 + 4;
      } while (99999 < uVar15);
      uVar19 = uVar19 + 1;
    }
LAB_00204684:
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar19 - (char)((int)XVar4 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1a8._M_dataplus._M_p + (XVar4 >> 0x1f),uVar19,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_4a0,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_178 = (PFN_xrSetInputDeviceStateFloatEXT)0x0;
    p_Stack_170 = (PFN_xrSetInputDeviceStateVector2fEXT)0x0;
    local_188 = (PFN_xrSetInputDeviceActiveEXT)0x0;
    p_Stack_180 = (PFN_xrSubmitDebugUtilsMessageEXT)0x0;
    local_1a8.field_2._M_allocated_capacity = 0;
    local_1a8.field_2._8_8_ = 0;
    local_1a8._M_dataplus._M_p = (pointer)0x0;
    local_1a8._M_string_length = 0;
    p_Var8 = gen_dispatch_table->StructureTypeToString;
    pXVar13 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var8)(pXVar13,value->type,(char *)&local_1a8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_4a0,(char (*) [64])&local_1a8);
  }
  local_4c0 = local_4b0;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4c0);
  value_00 = value->next;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_4c0,local_4b8 + (long)local_4c0);
  bVar11 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_360,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if (!bVar11) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"0x",2);
  *(uint *)((long)&local_1a8.field_2 + *(long *)(local_1a8._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8.field_2 + *(long *)(local_1a8._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint64_t",&local_420,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  pXVar2 = (XrPlaneDetectorLocationEXT *)(local_320 + 0x10);
  if ((XrPlaneDetectorLocationEXT *)local_320._0_8_ != pXVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_440,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_440);
  uVar18 = value->locationFlags;
  cVar20 = '\x01';
  if (9 < uVar18) {
    uVar17 = uVar18;
    cVar10 = '\x04';
    do {
      cVar20 = cVar10;
      if (uVar17 < 100) {
        cVar20 = cVar20 + -2;
        goto LAB_00204910;
      }
      if (uVar17 < 1000) {
        cVar20 = cVar20 + -1;
        goto LAB_00204910;
      }
      if (uVar17 < 10000) goto LAB_00204910;
      bVar11 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      cVar10 = cVar20 + '\x04';
    } while (bVar11);
    cVar20 = cVar20 + '\x01';
  }
LAB_00204910:
  local_320._0_8_ = pXVar2;
  std::__cxx11::string::_M_construct((ulong)local_320,cVar20);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_320._0_8_,local_320._8_4_,uVar18);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[21],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [21])"XrSpaceLocationFlags",&local_440,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrPlaneDetectorLocationEXT *)local_320._0_8_ != pXVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_4e0 = local_4d0;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e0,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_4e0);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_4e0,local_4d8 + (long)local_4e0);
  pXVar21 = (XrGeneratedDispatchTable *)local_3a0;
  local_3a0._0_8_ = local_3a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"XrPosef","");
  bVar11 = ApiDumpOutputXrStruct(pXVar21,&value->pose,&local_380,(string *)local_3a0,false,contents)
  ;
  if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
    operator_delete((void *)local_3a0._0_8_,(ulong)(local_390._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (!bVar11) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_500 = local_4f0;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_500,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_500);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,local_500,local_4f8 + (long)local_500);
  pXVar21 = (XrGeneratedDispatchTable *)local_3e0;
  local_3e0._0_8_ = local_3e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"XrExtent2Df","");
  bVar11 = ApiDumpOutputXrStruct
                     (pXVar21,&value->extents,&local_3c0,(string *)local_3e0,false,contents);
  if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
    operator_delete((void *)local_3e0._0_8_,(ulong)(local_3d0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar11) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"Invalid Operation");
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_460);
  XVar5 = value->orientation;
  __val_00 = -XVar5;
  if (0 < (int)XVar5) {
    __val_00 = XVar5;
  }
  uVar19 = 1;
  if (9 < __val_00) {
    uVar18 = (ulong)__val_00;
    uVar9 = 4;
    do {
      uVar19 = uVar9;
      uVar15 = (uint)uVar18;
      if (uVar15 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_00204bd1;
      }
      if (uVar15 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_00204bd1;
      }
      if (uVar15 < 10000) goto LAB_00204bd1;
      uVar18 = uVar18 / 10000;
      uVar9 = uVar19 + 4;
    } while (99999 < uVar15);
    uVar19 = uVar19 + 1;
  }
LAB_00204bd1:
  local_320._0_8_ = pXVar2;
  std::__cxx11::string::_M_construct((ulong)local_320,(char)uVar19 - (char)((int)XVar5 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_320._0_8_ + (ulong)(XVar5 >> 0x1f)),uVar19,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[30],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [30])"XrPlaneDetectorOrientationEXT",&local_460,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrPlaneDetectorLocationEXT *)local_320._0_8_ != pXVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  pcVar7 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_480);
  XVar6 = value->semanticType;
  __val_01 = -XVar6;
  if (0 < (int)XVar6) {
    __val_01 = XVar6;
  }
  uVar19 = 1;
  if (9 < __val_01) {
    uVar18 = (ulong)__val_01;
    uVar9 = 4;
    do {
      uVar19 = uVar9;
      uVar15 = (uint)uVar18;
      if (uVar15 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_00204cd5;
      }
      if (uVar15 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_00204cd5;
      }
      if (uVar15 < 10000) goto LAB_00204cd5;
      uVar18 = uVar18 / 10000;
      uVar9 = uVar19 + 4;
    } while (99999 < uVar15);
    uVar19 = uVar19 + 1;
  }
LAB_00204cd5:
  local_320._0_8_ = pXVar2;
  std::__cxx11::string::_M_construct((ulong)local_320,(char)uVar19 - (char)((int)XVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_320._0_8_ + (ulong)(XVar6 >> 0x1f)),uVar19,__val_01);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[31],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [31])"XrPlaneDetectorSemanticTypeEXT",&local_480,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrPlaneDetectorLocationEXT *)local_320._0_8_ != pXVar2) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  pcVar7 = (prefix->_M_dataplus)._M_p;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar7,pcVar7 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_400);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)((long)auStack_308 + *(long *)(local_320._0_8_ + -0x18)) =
       *(uint *)((long)auStack_308 + *(long *)(local_320._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_400,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,(ulong)(local_340.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500,local_4f0[0] + 1);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0,local_4d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0,local_4b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPlaneDetectorLocationEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string planeid_prefix = prefix;
        planeid_prefix += "planeId";
        std::ostringstream oss_planeId;
        oss_planeId << "0x" << std::hex << (value->planeId);
        contents.emplace_back("uint64_t", planeid_prefix, oss_planeId.str());
        std::string locationflags_prefix = prefix;
        locationflags_prefix += "locationFlags";
        contents.emplace_back("XrSpaceLocationFlags", locationflags_prefix, std::to_string(value->locationFlags));
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string extents_prefix = prefix;
        extents_prefix += "extents";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->extents, extents_prefix, "XrExtent2Df", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string orientation_prefix = prefix;
        orientation_prefix += "orientation";
        contents.emplace_back("XrPlaneDetectorOrientationEXT", orientation_prefix, std::to_string(value->orientation));
        std::string semantictype_prefix = prefix;
        semantictype_prefix += "semanticType";
        contents.emplace_back("XrPlaneDetectorSemanticTypeEXT", semantictype_prefix, std::to_string(value->semanticType));
        std::string polygonbuffercount_prefix = prefix;
        polygonbuffercount_prefix += "polygonBufferCount";
        std::ostringstream oss_polygonBufferCount;
        oss_polygonBufferCount << "0x" << std::hex << (value->polygonBufferCount);
        contents.emplace_back("uint32_t", polygonbuffercount_prefix, oss_polygonBufferCount.str());
        return true;
    } catch(...) {
    }
    return false;
}